

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwise.cpp
# Opt level: O0

char duckdb::BitwiseShiftLeftOperator::Operation<signed_char,signed_char,signed_char>
               (char input,char shift)

{
  char cVar1;
  undefined8 uVar2;
  byte in_SIL;
  char in_DIL;
  char max_value;
  char max_shift;
  undefined8 in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  string *in_stack_fffffffffffffeb8;
  OutOfRangeException *in_stack_fffffffffffffec0;
  allocator local_129;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  string *in_stack_fffffffffffffee8;
  OutOfRangeException *in_stack_fffffffffffffef0;
  allocator local_d9;
  string local_d8 [39];
  undefined1 local_b1;
  allocator local_89;
  string local_88 [39];
  undefined1 local_61;
  allocator local_29;
  string local_28 [36];
  undefined1 local_4;
  byte local_3;
  char local_2;
  char local_1;
  
  local_4 = 8;
  cVar1 = (char)((ulong)in_stack_fffffffffffffe48 >> 0x38);
  if (in_DIL < '\0') {
    local_61 = 1;
    uVar2 = __cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_28,"Cannot left-shift negative number %s",&local_29);
    NumericHelper::ToString<signed_char>(cVar1);
    OutOfRangeException::OutOfRangeException<std::__cxx11::string>
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
    local_61 = 0;
    __cxa_throw(uVar2,&OutOfRangeException::typeinfo,OutOfRangeException::~OutOfRangeException);
  }
  if (-1 < (char)in_SIL) {
    if ((char)in_SIL < '\b') {
      local_1 = in_DIL;
      if (in_SIL != 0) {
        local_3 = in_SIL;
        local_2 = in_DIL;
        cVar1 = UnsafeNumericCast<signed_char,int,void>(1 << (7 - in_SIL & 0x1f));
        if (cVar1 <= local_2) {
          uVar2 = __cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&stack0xfffffffffffffed8,"Overflow in left shift (%s << %s)",
                     &local_129);
          cVar1 = (char)((ulong)uVar2 >> 0x38);
          NumericHelper::ToString<signed_char>(cVar1);
          NumericHelper::ToString<signed_char>(cVar1);
          OutOfRangeException::OutOfRangeException<std::__cxx11::string,std::__cxx11::string>
                    (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                     in_stack_fffffffffffffed8);
          __cxa_throw(uVar2,&OutOfRangeException::typeinfo,OutOfRangeException::~OutOfRangeException
                     );
        }
        local_1 = UnsafeNumericCast<signed_char,int,void>((int)local_2 << (local_3 & 0x1f));
      }
    }
    else {
      if (in_DIL != '\0') {
        uVar2 = __cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_d8,"Left-shift value %s is out of range",&local_d9);
        NumericHelper::ToString<signed_char>(cVar1);
        OutOfRangeException::OutOfRangeException<std::__cxx11::string>
                  (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
        __cxa_throw(uVar2,&OutOfRangeException::typeinfo,OutOfRangeException::~OutOfRangeException);
      }
      local_1 = '\0';
    }
    return local_1;
  }
  local_b1 = 1;
  uVar2 = __cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"Cannot left-shift by negative number %s",&local_89);
  NumericHelper::ToString<signed_char>(cVar1);
  OutOfRangeException::OutOfRangeException<std::__cxx11::string>
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  local_b1 = 0;
  __cxa_throw(uVar2,&OutOfRangeException::typeinfo,OutOfRangeException::~OutOfRangeException);
}

Assistant:

static inline TR Operation(TA input, TB shift) {
		TA max_shift = TA(sizeof(TA) * 8) + (NumericLimits<TA>::IsSigned() ? 0 : 1);
		if (input < 0) {
			throw OutOfRangeException("Cannot left-shift negative number %s", NumericHelper::ToString(input));
		}
		if (shift < 0) {
			throw OutOfRangeException("Cannot left-shift by negative number %s", NumericHelper::ToString(shift));
		}
		if (shift >= max_shift) {
			if (input == 0) {
				return 0;
			}
			throw OutOfRangeException("Left-shift value %s is out of range", NumericHelper::ToString(shift));
		}
		if (shift == 0) {
			return input;
		}
		TA max_value = UnsafeNumericCast<TA>((TA(1) << (max_shift - shift - 1)));
		if (input >= max_value) {
			throw OutOfRangeException("Overflow in left shift (%s << %s)", NumericHelper::ToString(input),
			                          NumericHelper::ToString(shift));
		}
		return UnsafeNumericCast<TR>(input << shift);
	}